

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nocpout.c
# Opt level: O3

int ion_declared(Symbol *s)

{
  List *pLVar1;
  int iVar2;
  
  iVar2 = 0;
  for (pLVar1 = useion->next; pLVar1 != useion; pLVar1 = pLVar1->next->next->next->next) {
    if ((Symbol *)(pLVar1->element).itm == s) {
      iVar2 = 1;
    }
  }
  return iVar2;
}

Assistant:

int ion_declared(Symbol* s) {
	Item* q;
	int used = 0;
	ITERATE(q, useion) {
		if (SYM(q) == s) {
			used = 1;
		}
		q = q->next->next->next;
	}
	return used;
}